

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O3

vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> * __thiscall
tinyusdz::GeomMesh::get_normals
          (vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
           *__return_storage_ptr__,GeomMesh *this,double time,TimeSampleInterpolationType interp)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *this_00;
  pointer pcVar1;
  bool bVar2;
  bool bVar3;
  const_iterator cVar4;
  mapped_type *pmVar5;
  storage_t<unsigned_int> elementSize;
  undefined1 uVar6;
  ulong uVar7;
  _Alloc_hider _Var8;
  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> value;
  vector<int,_std::allocator<int>_> indices;
  string err;
  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> expanded_normals;
  Attribute indexAttr;
  string local_3c8;
  vector<int,_std::allocator<int>_> local_3a8;
  string local_388;
  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> local_368;
  undefined1 local_350 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_340;
  undefined1 local_330;
  undefined1 local_32c;
  string local_328 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  storage_union local_308;
  vtable_type *local_2f8;
  undefined1 local_2f0 [16];
  storage_union local_2e0;
  undefined1 *local_2d0;
  bool local_2c8 [8];
  pointer local_2c0;
  undefined1 uStack_2b8;
  undefined7 uStack_2b7;
  undefined1 auStack_2b0 [24];
  bool bStack_298;
  undefined7 local_297;
  undefined1 auStack_290 [56];
  undefined1 local_258 [72];
  storage_t<tinyusdz::Token> local_210;
  bool local_1f0;
  storage_t<tinyusdz::Token> local_1e8;
  bool local_1c8;
  storage_t<tinyusdz::Token> local_1c0;
  bool local_1a0;
  undefined1 local_198 [56];
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_160;
  bool local_140;
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_138;
  bool local_118;
  storage_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  bool local_f0;
  storage_t<tinyusdz::Token> local_e8;
  undefined1 local_c0 [24];
  pointer local_a8;
  size_t local_a0;
  pointer pSStack_98;
  pointer local_90;
  pointer pSStack_88;
  pointer local_80;
  pointer piStack_78;
  pointer local_70;
  pointer pSStack_68;
  pointer local_60;
  pointer pSStack_58;
  bool local_50;
  bool local_48;
  storage_t<int> local_44;
  bool local_40;
  storage_t<unsigned_int> local_3c;
  bool local_38;
  storage_t<tinyusdz::Interpolation> local_34;
  
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>)._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>)._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>)._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
  local_388._M_string_length = 0;
  local_388.field_2._M_local_buf[0] = '\0';
  local_350._0_8_ = &local_340;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_350,"normals","");
  bVar2 = GPrim::has_primvar(&this->super_GPrim,(string *)local_350);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._0_8_ != &local_340) {
    operator_delete((void *)local_350._0_8_,
                    CONCAT71(local_340._M_allocated_capacity._1_7_,local_340._M_local_buf[0]) + 1);
  }
  if (bVar2) {
    local_328._0_8_ = &local_318;
    local_350._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_340._M_local_buf[0] = '\0';
    _local_330 = _local_330 & 0xffffff00;
    local_328[8] = (string)0x0;
    local_328[9] = (string)0x0;
    local_328[10] = (string)0x0;
    local_328[0xb] = (string)0x0;
    local_328[0xc] = (string)0x0;
    local_328[0xd] = (string)0x0;
    local_328[0xe] = (string)0x0;
    local_328[0xf] = (string)0x0;
    local_318._M_local_buf[0] = '\0';
    local_308._0_4_ = Varying;
    local_308._4_1_ = false;
    local_308._8_8_ = local_2f0;
    local_2f8 = (vtable_type *)0x0;
    local_2f0[0] = '\0';
    local_2d0 = linb::any::vtable_for_type<decltype(nullptr)>()::table;
    local_2e0.dynamic = (void *)0x0;
    local_2c8[0] = false;
    local_2c0 = (pointer)0x0;
    uStack_2b8 = 0;
    uStack_2b7 = 0;
    auStack_2b0[0] = false;
    auStack_2b0._1_8_ = 0;
    auStack_290._12_4_ = (storage_t<tinyusdz::Interpolation>)0x0;
    auStack_290[0x10] = false;
    auStack_290._20_4_ = (storage_t<unsigned_int>)0x0;
    auStack_290[0x18] = false;
    auStack_290[0x19] = (storage_t<bool>)0x0;
    auStack_290[0x20] = false;
    local_210._24_8_ = (storage_t<double>)0x0;
    local_1f0 = false;
    local_e8._16_8_ = 0;
    local_e8._24_8_ = 0;
    local_e8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    local_e8._8_8_ = 0;
    local_c0._16_8_ = local_c0;
    local_c0._0_4_ = _S_red;
    local_c0._8_8_ = (pointer)0x0;
    auStack_290._40_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    auStack_290._48_8_ = 0;
    local_258._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_258._8_8_ = 0;
    local_258._16_8_ = 0;
    local_258._24_8_ = 0;
    local_258[0x20] = false;
    local_258._40_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_258._48_8_ = 0;
    local_258._56_8_ = 0;
    local_258._64_8_ = 0;
    local_210.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    local_210._8_8_ = 0;
    local_210._16_1_ = false;
    local_1e8.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    local_1e8._8_8_ = 0;
    local_1e8._16_8_ = 0;
    local_1e8._24_8_ = 0;
    local_1c8 = false;
    local_1c0.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    local_1c0._8_8_ = 0;
    local_1c0._16_8_ = 0;
    local_1c0._24_8_ = 0;
    local_1a0 = false;
    local_198[0x20] = false;
    local_198._16_8_ = 0;
    local_198._24_8_ = 0;
    local_198._0_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_198._8_8_ = 0;
    local_140 = false;
    local_160._16_8_ = 0;
    local_160._24_8_ = 0;
    local_160.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    local_160._8_8_ = 0;
    local_198._40_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_198._48_8_ = 0;
    local_118 = false;
    local_138._16_8_ = 0;
    local_138._24_8_ = 0;
    local_138.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    local_138._8_8_ = 0;
    local_f0 = false;
    local_110._16_8_ = 0;
    local_110._24_8_ = 0;
    local_110.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    local_110._8_8_ = 0;
    auStack_290[0] = 0;
    auStack_290._1_8_ = 0;
    auStack_2b0._16_8_ = (pointer)0x0;
    bStack_298 = false;
    local_297 = 0;
    local_48 = false;
    local_44 = (storage_t<int>)0x0;
    local_40 = false;
    local_3c = (storage_t<unsigned_int>)0x0;
    local_38 = false;
    local_34 = (storage_t<tinyusdz::Interpolation>)0x0;
    local_50 = false;
    local_60 = (pointer)0x0;
    pSStack_58 = (pointer)0x0;
    local_70 = (pointer)0x0;
    pSStack_68 = (pointer)0x0;
    local_80 = (pointer)0x0;
    piStack_78 = (pointer)0x0;
    local_90 = (pointer)0x0;
    pSStack_88 = (pointer)0x0;
    local_a0 = 0;
    pSStack_98 = (pointer)0x0;
    local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
    local_350._0_8_ = &local_340;
    local_a8 = (pointer)local_c0._16_8_;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"normals","");
    bVar2 = GPrim::get_primvar(&this->super_GPrim,&local_3c8,(GeomPrimvar *)local_350,&local_388);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
      operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
    }
    if (bVar2) {
      GeomPrimvar::flatten_with_indices<tinyusdz::value::normal3f>
                ((GeomPrimvar *)local_350,time,__return_storage_ptr__,interp,(string *)0x0);
    }
    GeomPrimvar::~GeomPrimvar((GeomPrimvar *)local_350);
  }
  else if ((((this->normals)._attrib.has_value_ != false) ||
           (((this->normals)._paths.
             super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
             super__Vector_impl_data._M_finish ==
             (this->normals)._paths.
             super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
             super__Vector_impl_data._M_start &&
            (((this->normals)._value_empty != false || ((this->normals)._blocked == true)))))) &&
          ((this->normals)._blocked == false)) {
    local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    this_00 = &(this->super_GPrim).props;
    local_350._0_8_ = &local_340;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_350,"normals:indices","");
    cVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
            ::find(&this_00->_M_t,(key_type *)local_350);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._0_8_ != &local_340) {
      operator_delete((void *)local_350._0_8_,
                      CONCAT71(local_340._M_allocated_capacity._1_7_,local_340._M_local_buf[0]) + 1)
      ;
    }
    if ((_Rb_tree_header *)cVar4._M_node ==
        &(this->super_GPrim).props._M_t._M_impl.super__Rb_tree_header) {
      bVar2 = false;
LAB_0018322c:
      local_3c8._M_dataplus._M_p = (pointer)0x0;
      local_3c8._M_string_length = 0;
      local_3c8.field_2._M_allocated_capacity = 0;
      nonstd::optional_lite::
      optional<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
      ::optional((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
                  *)local_350,&(this->normals)._attrib);
      if ((string)local_350[0] == (string)0x0) {
        __assert_fail("has_value()",
                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                      ,0x584,
                      "const value_type &nonstd::optional_lite::optional<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f>>>::value() const [T = tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f>>]"
                     );
      }
      bVar3 = Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>
              ::get((Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>
                     *)(local_350 + 8),time,
                    (vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *
                    )&local_3c8,interp);
      if ((string)local_350[0] == (string)0x1) {
        nonstd::optional_lite::detail::
        storage_t<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
        ::destruct_value((storage_t<tinyusdz::Animatable<std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>_>_>
                          *)(local_350 + 8));
      }
      if (bVar3) {
        if (local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start) {
          std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::
          operator=(__return_storage_ptr__,
                    (vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *
                    )&local_3c8);
          uVar6 = 1;
        }
        else {
          elementSize = (storage_t<unsigned_int>)0x1;
          if ((this->normals)._metas.elementSize.has_value_ != false) {
            elementSize = (this->normals)._metas.elementSize.contained;
          }
          local_368.
          super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_368.
          super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_368.
          super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          anon_unknown_0::ExpandWithIndices<tinyusdz::value::normal3f>
                    ((expected<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_350,
                     (vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                      *)&local_3c8,(uint32_t)elementSize,&local_3a8,&local_368);
          uVar6 = local_330;
          bVar3 = true;
          if ((bool)local_330 == true) {
            std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::
            operator=(__return_storage_ptr__,&local_368);
            bVar3 = bVar2;
          }
          if (((local_330 & 1) == 0) &&
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_350._0_8_ != &local_340)) {
            operator_delete((void *)local_350._0_8_,
                            CONCAT71(local_340._M_allocated_capacity._1_7_,local_340._M_local_buf[0]
                                    ) + 1);
          }
          bVar2 = bVar3;
          if (local_368.
              super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_368.
                            super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_368.
                                  super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_368.
                                  super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
        }
      }
      else {
        bVar2 = true;
        uVar6 = 0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_3c8._M_dataplus._M_p,
                        local_3c8.field_2._M_allocated_capacity - (long)local_3c8._M_dataplus._M_p);
      }
    }
    else {
      local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"normals:indices","");
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
               ::at(this_00,&local_3c8);
      local_350._0_8_ = &local_340;
      pcVar1 = (pmVar5->_attrib)._name._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_350,pcVar1,pcVar1 + (pmVar5->_attrib)._name._M_string_length);
      local_32c = (pmVar5->_attrib)._varying_authored;
      _local_330 = (pmVar5->_attrib)._variability;
      local_328._0_8_ = &local_318;
      pcVar1 = (pmVar5->_attrib)._type_name._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                (local_328,pcVar1,pcVar1 + (pmVar5->_attrib)._type_name._M_string_length);
      local_2f8 = (pmVar5->_attrib)._var._value.v_.vtable;
      if (local_2f8 != (vtable_type *)0x0) {
        (*local_2f8->copy)((storage_union *)&(pmVar5->_attrib)._var,&local_308);
      }
      local_2f0[0] = (pmVar5->_attrib)._var._blocked;
      std::
      vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ::vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                *)(local_2f0 + 8),&(pmVar5->_attrib)._var._ts._samples);
      local_2d0 = (undefined1 *)CONCAT71(local_2d0._1_7_,(pmVar5->_attrib)._var._ts._dirty);
      std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector
                ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_2c8,
                 &(pmVar5->_attrib)._paths);
      AttrMetas::AttrMetas((AttrMetas *)auStack_2b0,&(pmVar5->_attrib)._metas);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
        operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
      }
      bVar2 = Attribute::is_connection((Attribute *)local_350);
      if (bVar2) {
        bVar2 = true;
        bVar3 = false;
      }
      else {
        bVar3 = Attribute::get<std::vector<int,std::allocator<int>>>
                          ((Attribute *)local_350,time,&local_3a8,interp);
        bVar2 = !bVar3;
      }
      AttrMetas::~AttrMetas((AttrMetas *)auStack_2b0);
      std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_2c8);
      std::
      vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
      ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                 *)(local_2f0 + 8));
      if (local_2f8 != (vtable_type *)0x0) {
        (*local_2f8->destroy)(&local_308);
        local_2f8 = (vtable_type *)0x0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._0_8_ != &local_318) {
        operator_delete((void *)local_328._0_8_,
                        CONCAT71(local_318._M_allocated_capacity._1_7_,local_318._M_local_buf[0]) +
                        1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_350._0_8_ != &local_340) {
        operator_delete((void *)local_350._0_8_,
                        CONCAT71(local_340._M_allocated_capacity._1_7_,local_340._M_local_buf[0]) +
                        1);
      }
      if (bVar3 != false) goto LAB_0018322c;
      uVar6 = 0;
    }
    if (local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_3a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (uVar6 == 0) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388._M_dataplus._M_p != &local_388.field_2) {
        operator_delete(local_388._M_dataplus._M_p,
                        CONCAT71(local_388.field_2._M_allocated_capacity._1_7_,
                                 local_388.field_2._M_local_buf[0]) + 1);
      }
      if (bVar2) {
        return __return_storage_ptr__;
      }
      _Var8._M_p = (pointer)(__return_storage_ptr__->
                            super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                            )._M_impl.super__Vector_impl_data._M_start;
      if ((pointer)_Var8._M_p == (pointer)0x0) {
        return __return_storage_ptr__;
      }
      uVar7 = (long)(__return_storage_ptr__->
                    super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                    )._M_impl.super__Vector_impl_data._M_end_of_storage - (long)_Var8._M_p;
      goto LAB_001833c1;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_388._M_dataplus._M_p == &local_388.field_2) {
    return __return_storage_ptr__;
  }
  uVar7 = CONCAT71(local_388.field_2._M_allocated_capacity._1_7_,local_388.field_2._M_local_buf[0])
          + 1;
  _Var8._M_p = local_388._M_dataplus._M_p;
LAB_001833c1:
  operator_delete(_Var8._M_p,uVar7);
  return __return_storage_ptr__;
}

Assistant:

const std::vector<value::normal3f> GeomMesh::get_normals(
    double time, value::TimeSampleInterpolationType interp) const {
  std::vector<value::normal3f> dst;

  std::string err;
  if (has_primvar("normals")) {
    GeomPrimvar primvar;
    if (!get_primvar("normals", &primvar, &err)) {
      return dst;
    }

    primvar.flatten_with_indices(time, &dst, interp);
    return dst;
  } else if (normals.authored()) {
    if (normals.is_connection()) {
      // Not supported
      return dst;
    } else if (normals.is_blocked()) {
      return dst;
    }

    std::vector<int> indices;
    if (props.count("normals:indices")) {
      Attribute indexAttr = props.at("normals:indices").get_attribute();

      if (indexAttr.is_connection()) {
        // not supported.
        return dst;
      }

      if (!indexAttr.get_value(time, &indices, interp)) {
        // err
        return dst;
      }

    }

    std::vector<value::normal3f> value;
    if (!normals.get_value().value().get(time, &value, interp)) {
      return dst;
    }

    if (indices.size()) {
      uint32_t elementSize = normals.metas().elementSize.value_or(1);

      std::vector<value::normal3f> expanded_normals;
      auto ret = ExpandWithIndices(value, elementSize, indices, &expanded_normals);

      if (!ret) {
        return dst;
      }

      dst = expanded_normals;
    } else {
      dst = value;
    }
  }

  return dst;
}